

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * jx9_context_new_array(jx9_context *pCtx)

{
  jx9_value *pjVar1;
  jx9_value *pVal;
  jx9_value *local_18;
  
  pjVar1 = jx9_new_array(pCtx->pVm);
  if (pjVar1 != (jx9_value *)0x0) {
    local_18 = pjVar1;
    SySetPut(&pCtx->sVar,&local_18);
  }
  return pjVar1;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_context_new_array(jx9_context *pCtx)
{
	jx9_value *pVal;
	pVal = jx9_new_array(pCtx->pVm);
	if( pVal ){
		/* Record value address so it can be freed automatically
		 * when the calling function returns. 
		 */
		SySetPut(&pCtx->sVar, (const void *)&pVal);
	}
	return pVal;
}